

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

size_type __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr)

{
  bool bVar1;
  MemChunk *this_00;
  MemChunk *chunk;
  void *ptr_local;
  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  if (ptr == (void *)0x0) {
    this_local = (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)0x0;
  }
  else {
    this_00 = mem2Chunk(ptr);
    bVar1 = MemChunk::isUsed(this_00);
    if (bVar1) {
      this_local = (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                   MemChunk::getUserSize(this_00);
    }
    else {
      this_local = (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)0x0;
    }
  }
  return (size_type)this_local;
}

Assistant:

size_type
    getUserSize (T* ptr)
    {
        if (ptr == nullptr)
        {
            return 0;
        }
        MemChunk* chunk = mem2Chunk (ptr);
        if (chunk->isUsed ())
        {
            return chunk->getUserSize ();
        }
        return 0;
    }